

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreDisassembler.c
# Opt level: O0

DecodeStatus Decode3OpInstruction(uint Insn,uint *Op1,uint *Op2,uint *Op3)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint Combined;
  uint Op3High;
  uint Op2High;
  uint Op1High;
  uint *Op3_local;
  uint *Op2_local;
  uint *Op1_local;
  uint Insn_local;
  
  uVar1 = fieldFromInstruction_4(Insn,6,5);
  if (uVar1 < 0x1b) {
    uVar2 = fieldFromInstruction_4(Insn,4,2);
    *Op1 = uVar1 % 3 << 2 | uVar2;
    uVar2 = fieldFromInstruction_4(Insn,2,2);
    *Op2 = (int)(((ulong)uVar1 / 3) % 3) << 2 | uVar2;
    uVar2 = fieldFromInstruction_4(Insn,0,2);
    *Op3 = uVar1 / 9 << 2 | uVar2;
    Op1_local._4_4_ = MCDisassembler_Success;
  }
  else {
    Op1_local._4_4_ = MCDisassembler_Fail;
  }
  return Op1_local._4_4_;
}

Assistant:

static DecodeStatus Decode3OpInstruction(unsigned Insn,
		unsigned *Op1, unsigned *Op2, unsigned *Op3)
{
	unsigned Op1High, Op2High, Op3High;
	unsigned Combined = fieldFromInstruction_4(Insn, 6, 5);
	if (Combined >= 27)
		return MCDisassembler_Fail;

	Op1High = Combined % 3;
	Op2High = (Combined / 3) % 3;
	Op3High = Combined / 9;
	*Op1 = (Op1High << 2) | fieldFromInstruction_4(Insn, 4, 2);
	*Op2 = (Op2High << 2) | fieldFromInstruction_4(Insn, 2, 2);
	*Op3 = (Op3High << 2) | fieldFromInstruction_4(Insn, 0, 2);

	return MCDisassembler_Success;
}